

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O0

ngx_err_t ngx_create_full_path(u_char *dir,ngx_uint_t access)

{
  int iVar1;
  int *piVar2;
  int local_30;
  ngx_err_t err;
  u_char ch;
  u_char *p;
  ngx_uint_t access_local;
  u_char *dir_local;
  
  local_30 = 0;
  _err = dir + 1;
  do {
    if (*_err == '\0') {
      return local_30;
    }
    if (*_err == '/') {
      *_err = '\0';
      iVar1 = mkdir((char *)dir,(__mode_t)access);
      if (iVar1 == -1) {
        piVar2 = __errno_location();
        local_30 = *piVar2;
        if (local_30 != 0xd) {
          if (local_30 != 0x11) {
            return local_30;
          }
          local_30 = 0;
        }
      }
      *_err = '/';
    }
    _err = _err + 1;
  } while( true );
}

Assistant:

ngx_err_t
ngx_create_full_path(u_char *dir, ngx_uint_t access)
{
    u_char     *p, ch;
    ngx_err_t   err;

    err = 0;

#if (NGX_WIN32)
    p = dir + 3;
#else
    p = dir + 1;
#endif

    for ( /* void */ ; *p; p++) {
        ch = *p;

        if (ch != '/') {
            continue;
        }

        *p = '\0';

        if (ngx_create_dir(dir, access) == NGX_FILE_ERROR) {
            err = ngx_errno;

            switch (err) {
            case NGX_EEXIST:
                err = 0;
            case NGX_EACCES:
                break;

            default:
                return err;
            }
        }

        *p = '/';
    }

    return err;
}